

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::SerializeWithCachedSizes
          (CustomModel_CustomModelParamValue *this,CodedOutputStream *output)

{
  uint32 uVar1;
  ValueUnion value;
  
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 10) {
    google::protobuf::internal::WireFormatLite::WriteDouble(10,(this->value_).doublevalue_,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x14) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (*(char **)(this->value_).longvalue_,
               *(int *)((undefined8 *)(this->value_).longvalue_ + 1),SERIALIZE,
               "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue");
    if (this->_oneof_case_[0] == 0x14) {
      value = this->value_;
    }
    else {
      value = (ValueUnion)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x14,(string *)value,output)
    ;
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x1e) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0x1e,(this->value_).intvalue_,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x28) {
    google::protobuf::internal::WireFormatLite::WriteInt64(0x28,(this->value_).longvalue_,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x32) {
    google::protobuf::internal::WireFormatLite::WriteBool
              (0x32,(bool)((this->value_).boolvalue_ & 1),output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x3c) {
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased
              (0x3c,(string *)this->value_,output);
    return;
  }
  return;
}

Assistant:

void CustomModel_CustomModelParamValue::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // double doubleValue = 10;
  if (has_doublevalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteDouble(10, this->doublevalue(), output);
  }

  // string stringValue = 20;
  if (has_stringvalue()) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->stringvalue().data(), this->stringvalue().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      20, this->stringvalue(), output);
  }

  // int32 intValue = 30;
  if (has_intvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(30, this->intvalue(), output);
  }

  // int64 longValue = 40;
  if (has_longvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(40, this->longvalue(), output);
  }

  // bool boolValue = 50;
  if (has_boolvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(50, this->boolvalue(), output);
  }

  // bytes bytesValue = 60;
  if (has_bytesvalue()) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      60, this->bytesvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CustomModel.CustomModelParamValue)
}